

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_dr_wav_s24_to_s16(ma_int16 *pOut,ma_uint8 *pIn,size_t sampleCount)

{
  size_t sVar1;
  ma_int16 *pmVar2;
  
  if (sampleCount != 0) {
    pmVar2 = (ma_int16 *)(pIn + 1);
    sVar1 = 0;
    do {
      pOut[sVar1] = *pmVar2;
      sVar1 = sVar1 + 1;
      pmVar2 = (ma_int16 *)((long)pmVar2 + 3);
    } while (sampleCount != sVar1);
  }
  return;
}

Assistant:

MA_API void ma_dr_wav_s24_to_s16(ma_int16* pOut, const ma_uint8* pIn, size_t sampleCount)
{
    int r;
    size_t i;
    for (i = 0; i < sampleCount; ++i) {
        int x = ((int)(((unsigned int)(((const ma_uint8*)pIn)[i*3+0]) << 8) | ((unsigned int)(((const ma_uint8*)pIn)[i*3+1]) << 16) | ((unsigned int)(((const ma_uint8*)pIn)[i*3+2])) << 24)) >> 8;
        r = x >> 8;
        pOut[i] = (short)r;
    }
}